

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teleport.c
# Opt level: O0

int badpos(level *lev,int x,int y,monst *mtmp,uint gpflags)

{
  boolean bVar1;
  int iVar2;
  obj *poVar3;
  bool bVar4;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  monst *local_58;
  monst *mtmp2;
  permonst *ppStack_40;
  boolean ignorewater;
  permonst *mdat;
  int local_30;
  int pool;
  int is_badpos;
  uint gpflags_local;
  monst *mtmp_local;
  int y_local;
  int x_local;
  level *lev_local;
  
  local_30 = 0;
  ppStack_40 = (permonst *)0x0;
  bVar4 = (gpflags & 0x80) == 0;
  if ((((mtmp != &youmonst) && (x == u.ux)) && (y == u.uy)) &&
     ((u.usteed == (monst *)0x0 || (mtmp != u.usteed)))) {
    local_30 = 1;
  }
  if (mtmp != (monst *)0x0) {
    if ((lev->monsters[x][y] == (monst *)0x0) ||
       ((*(uint *)&lev->monsters[x][y]->field_0x60 >> 9 & 1) != 0)) {
      local_58 = (monst *)0x0;
    }
    else {
      local_58 = lev->monsters[x][y];
    }
    if ((local_58 != (monst *)0x0) && ((local_58 != mtmp || (mtmp->wormno != '\0')))) {
      local_30 = 1;
    }
    ppStack_40 = mtmp->data;
    bVar1 = is_pool(lev,x,y);
    if ((((ppStack_40->mlet == '9') && (bVar1 == '\0')) && (iVar2 = rn2(0xd), iVar2 != 0)) &&
       (bVar4)) {
      local_30 = 1;
    }
    if ((bVar1 != '\0') && (bVar4)) {
      if (mtmp == &youmonst) {
        if (((((u.uprops[0x12].intrinsic == 0) && (u.uprops[0x3c].extrinsic == 0)) &&
             (((youmonst.data)->mflags1 & 1) == 0)) &&
            (((u.usteed == (monst *)0x0 || (((u.usteed)->data->mflags1 & 1) == 0)) &&
             ((((u.uprops[0x27].extrinsic == 0 ||
                (bVar1 = on_level(&u.uz,&dungeon_topology.d_water_level), bVar1 != '\0')) &&
               ((u.uprops[0x39].intrinsic == 0 && (u.uprops[0x39].extrinsic == 0)))) &&
              (((youmonst.data)->mflags1 & 2) == 0)))))) &&
           ((((u.usteed == (monst *)0x0 || (((u.usteed)->data->mflags1 & 2) == 0)) &&
             (u.uprops[0x31].intrinsic == 0)) &&
            ((u.uprops[0x31].extrinsic == 0 && (((youmonst.data)->mflags1 & 0x600) == 0)))))) {
          local_5c = -1;
        }
        else {
          local_5c = local_30;
        }
        return local_5c;
      }
      if ((((ppStack_40->mflags1 & 1) == 0) && ((ppStack_40->mflags1 & 2) == 0)) &&
         ((ppStack_40->mflags1 & 0x10) == 0)) {
        local_60 = -1;
      }
      else {
        local_60 = local_30;
      }
      return local_60;
    }
    bVar1 = is_lava(lev,x,y);
    if (bVar1 != '\0') {
      if (mtmp == &youmonst) {
        if (u.uprops[0x12].intrinsic == 0) {
          local_64 = -1;
        }
        else {
          local_64 = local_30;
        }
        return local_64;
      }
      if ((((ppStack_40->mflags1 & 1) == 0) && (ppStack_40 != mons + 0xa0)) &&
         (ppStack_40 != mons + 0x157)) {
        local_68 = -1;
      }
      else {
        local_68 = local_30;
      }
      return local_68;
    }
    if (((ppStack_40->mflags1 & 8) != 0) &&
       (bVar1 = may_passwall(lev,(xchar)x,(xchar)y), bVar1 != '\0')) {
      return local_30;
    }
  }
  if ((lev->locations[x][y].typ < '\x17') && ((bVar1 = is_pool(lev,x,y), bVar1 == '\0' || (bVar4))))
  {
    lev_local._4_4_ = -1;
  }
  else {
    bVar1 = closed_door(lev,x,y);
    if ((bVar1 == '\0') || ((ppStack_40 != (permonst *)0x0 && ((ppStack_40->mflags1 & 4) != 0)))) {
      poVar3 = sobj_at(0x214,lev,x,y);
      if ((poVar3 == (obj *)0x0) ||
         ((ppStack_40 != (permonst *)0x0 && ((ppStack_40->mflags2 & 0x8000000) != 0)))) {
        lev_local._4_4_ = local_30;
      }
      else {
        lev_local._4_4_ = 1;
        if (ppStack_40 != (permonst *)0x0) {
          lev_local._4_4_ = -1;
        }
      }
    }
    else {
      bVar4 = false;
      if ((ppStack_40 != (permonst *)0x0) && (bVar4 = true, (ppStack_40->mflags1 & 0x2000) == 0)) {
        bVar4 = ppStack_40->msize == '\0';
      }
      lev_local._4_4_ = 1;
      if (bVar4) {
        lev_local._4_4_ = -1;
      }
    }
  }
  return lev_local._4_4_;
}

Assistant:

static int badpos(struct level *lev, int x, int y, struct monst *mtmp,
		   unsigned gpflags)
{
	int is_badpos = 0, pool;
	const struct permonst *mdat = NULL;
	boolean ignorewater = ((gpflags & MM_IGNOREWATER) != 0);
	struct monst *mtmp2;

	/* in many cases, we're trying to create a new monster, which
	 * can't go on top of the player or any existing monster.
	 * however, occasionally we are relocating engravings or objects,
	 * which could be co-located and thus get restricted a bit too much.
	 * oh well.
	 */
	if (mtmp != &youmonst && x == u.ux && y == u.uy &&
		(!u.usteed || mtmp != u.usteed))
	    is_badpos = 1;

	if (mtmp) {
	    mtmp2 = m_at(lev, x, y);

	    /* Be careful with long worms.  A monster may be placed back in
	     * its own location.  Normally, if m_at() returns the same monster
	     * that we're trying to place, the monster is being placed in its
	     * own location.  However, that is not correct for worm segments,
	     * because all the segments of the worm return the same m_at().
	     * Actually we overdo the check a little bit--a worm can't be placed
	     * in its own location, period.  If we just checked for mtmp->mx
	     * != x || mtmp->my != y, we'd miss the case where we're called
	     * to place the worm segment and the worm's head is at x,y.
	     */
	    if (mtmp2 && (mtmp2 != mtmp || mtmp->wormno))
		is_badpos = 1;

	    mdat = mtmp->data;
	    pool = is_pool(lev, x, y);
	    if (mdat->mlet == S_EEL && !pool && rn2(13) && !ignorewater)
		is_badpos = 1;

	    if (pool && !ignorewater) {
		if (mtmp == &youmonst)
			return (HLevitation || Flying || Wwalking ||
				Swimming || Amphibious) ? is_badpos : -1;
		else	return (is_flyer(mdat) || is_swimmer(mdat) ||
				is_clinger(mdat)) ? is_badpos : -1;
	    } else if (is_lava(lev, x, y)) {
		if (mtmp == &youmonst)
		    return HLevitation ? is_badpos : -1;
		else
		    return (is_flyer(mdat) || likes_lava(mdat)) ?
			    is_badpos : -1;
	    }
	    if (passes_walls(mdat) && may_passwall(lev, x, y)) return is_badpos;
	}
	if (!ACCESSIBLE(lev->locations[x][y].typ)) {
	    if (!(is_pool(lev, x, y) && ignorewater)) return -1;
	}

	if (closed_door(lev, x, y) && (!mdat || !amorphous(mdat)))
	    return mdat && (nohands(mdat) || verysmall(mdat)) ? -1 : 1;
	if (sobj_at(BOULDER, lev, x, y) && (!mdat || !throws_rocks(mdat)))
	    return mdat ? -1 : 1;
	return is_badpos;
}